

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_zeroblob(sqlite3_stmt *pStmt,int i,int n)

{
  int iVar1;
  Vdbe *p;
  int rc;
  int n_local;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  iVar1 = vdbeUnbind((Vdbe *)pStmt,i - 1);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetZeroBlob((Mem *)(*(long *)(pStmt + 0x80) + (long)(i + -1) * 0x38),n);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_zeroblob(sqlite3_stmt *pStmt, int i, int n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, (u32)(i-1));
  if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_INCRBLOB
    sqlite3VdbeMemSetZeroBlob(&p->aVar[i-1], n);
#else
    rc = sqlite3VdbeMemSetZeroBlob(&p->aVar[i-1], n);
#endif
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}